

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

bool __thiscall Graph<Node>::operator==(Graph<Node> *this,Graph<Node> *other)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  vector<Edge> v;
  vector<Edge> local_30;
  Edge *pEVar8;
  
  vector<Edge>::operator=(&local_30,&this->edges);
  pEVar8 = local_30.vect;
  uVar4 = (ulong)local_30._size;
  if (uVar4 != 0) {
    lVar6 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::__introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_30.vect,local_30.vect + uVar4,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>();
    if (0 < (long)local_30._size) {
      bVar5 = true;
      uVar4 = 1;
      lVar6 = 0;
      do {
        uVar1 = *(undefined8 *)((long)&((other->edges).vect)->_nodeS + lVar6);
        uVar2 = *(undefined8 *)((long)&(local_30.vect)->_nodeS + lVar6);
        iVar10 = -(uint)((int)uVar2 == (int)uVar1);
        iVar11 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20));
        auVar9._4_4_ = iVar10;
        auVar9._0_4_ = iVar10;
        auVar9._8_4_ = iVar11;
        auVar9._12_4_ = iVar11;
        uVar7 = movmskpd((int)pEVar8,auVar9);
        pEVar8 = (Edge *)(ulong)uVar7;
        bVar3 = uVar7 == 3;
        if (bVar5 < (uVar7 == 3)) {
          bVar3 = bVar5;
        }
        bVar5 = bVar3;
        if ((ulong)(long)local_30._size <= uVar4) break;
        lVar6 = lVar6 + 0xc;
        uVar4 = uVar4 + 1;
      } while (bVar5 != false);
      goto LAB_00101fcd;
    }
  }
  bVar5 = true;
  if (local_30.vect == (Edge *)0x0) {
    return true;
  }
LAB_00101fcd:
  operator_delete__(&local_30.vect[-1]._nodeD);
  return bVar5;
}

Assistant:

bool operator == (const Graph &other) const {
        vector <Edge> v = edges;
        std::sort(v.begin(), v.end());
//        v.mergeSort(0, v.size() - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        bool areEqual = true;
        for (int i = 0; i < v.size() and areEqual; ++i) {
            areEqual = min(areEqual, v[i] == other.getEdge(i));
        }

        return areEqual;
    }